

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          string *makefile,string *target)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string makefileName;
  string generator;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  local_a0.field_2._M_allocated_capacity = (long)&local_a0.field_2 + 8;
  local_a0._M_dataplus._M_p = (pointer)0x0;
  local_a0._M_string_length = 1;
  local_a0.field_2._M_local_buf[8] = '\"';
  local_68.first._M_len = 1;
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = (make->_M_dataplus)._M_p;
  local_50 = make->_M_string_length;
  local_40 = 0;
  local_f8.field_2._M_allocated_capacity = (long)&local_f8.field_2 + 8;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 1;
  local_f8.field_2._M_local_buf[8] = 0x22;
  local_38 = 1;
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  local_68.first._M_str = (char *)local_a0.field_2._M_allocated_capacity;
  local_30 = (undefined1 *)local_f8.field_2._M_allocated_capacity;
  cmCatViews(__return_storage_ptr__,views);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_68);
  iVar1 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar1 == 0) {
    cmSystemTools::ConvertToOutputPath(&local_a0,makefile);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    paVar4 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar4) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    std::operator+(&local_c0,", \"",target);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_f8.field_2._M_allocated_capacity = *psVar3;
      local_f8.field_2._8_8_ = plVar2[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar3;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar2;
    }
    local_f8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_f8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar4);
LAB_00447d72:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00447dbe;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      cmSystemTools::ConvertToOutputPath(&local_a0,makefile);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      paVar4 = &local_f8.field_2;
      local_f8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
      std::__cxx11::string::append((char *)&local_f8);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar4) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      std::operator+(&local_c0,", \"",target);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_f8.field_2._M_allocated_capacity = *psVar3;
        local_f8.field_2._8_8_ = plVar2[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar3;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar2;
      }
      local_f8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_f8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar4);
      goto LAB_00447d72;
    }
    local_a0._M_string_length = 0;
    local_a0.field_2._M_allocated_capacity =
         local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    iVar1 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar1 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_a0);
    }
    else {
      cmSystemTools::ConvertToOutputPath(&local_f8,makefile);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    paVar4 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar4) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    std::operator+(&local_c0,", \"",target);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_f8.field_2._M_allocated_capacity = *psVar3;
      local_f8.field_2._8_8_ = plVar2[3];
      local_f8._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar3;
      local_f8._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_f8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar4) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00447dbe;
  }
  operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1));
LAB_00447dbe:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_68.first._M_len !=
      &local_68.second) {
    operator_delete((void *)local_68.first._M_len,
                    (ulong)((long)&((local_68.second)->_M_dataplus)._M_p + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target)
{
  std::string command = cmStrCat('"', make, '"');
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}